

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

void Ver_ParseReportUndefBoxes(Ver_Man_t *pMan)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  int iVar10;
  
  iVar10 = 0;
  uVar7 = 0;
  while( true ) {
    pVVar8 = pMan->pDesign->vModules;
    iVar9 = pVVar8->nSize;
    if (iVar9 <= iVar10) break;
    pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar8,iVar10);
    pAVar4->fHiePath = 0;
    uVar2 = Ver_NtkIsDefined(pAVar4);
    uVar7 = uVar7 + (uVar2 ^ 1);
    iVar10 = iVar10 + 1;
  }
  for (iVar10 = 0; iVar10 < iVar9; iVar10 = iVar10 + 1) {
    pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar8,iVar10);
    for (iVar9 = 0; iVar9 < pAVar4->vBoxes->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = Abc_NtkBox(pAVar4,iVar9);
      if (((*(uint *)&pAVar5->field_0x14 & 0xf) == 10) &&
         ((Abc_Ntk_t *)(pAVar5->field_5).pData != (Abc_Ntk_t *)0x0)) {
        iVar3 = Ver_NtkIsDefined((Abc_Ntk_t *)(pAVar5->field_5).pData);
        if (iVar3 == 0) {
          piVar1 = (int *)((long)(pAVar5->field_5).pData + 0xc4);
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    pVVar8 = pMan->pDesign->vModules;
    iVar9 = pVVar8->nSize;
  }
  printf("Warning: The design contains %d undefined object types interpreted as blackboxes:\n",
         (ulong)uVar7);
  for (iVar10 = 0; pVVar8 = pMan->pDesign->vModules, iVar10 < pVVar8->nSize; iVar10 = iVar10 + 1) {
    pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar8,iVar10);
    iVar9 = Ver_NtkIsDefined(pAVar4);
    if (iVar9 == 0) {
      printf("%s (%d)  ",pAVar4->pName,(ulong)(uint)pAVar4->fHiePath);
    }
  }
  putchar(10);
  for (iVar10 = 0; pVVar8 = pMan->pDesign->vModules, iVar10 < pVVar8->nSize; iVar10 = iVar10 + 1) {
    pvVar6 = Vec_PtrEntry(pVVar8,iVar10);
    *(undefined4 *)((long)pvVar6 + 0xc4) = 0;
  }
  return;
}

Assistant:

void Ver_ParseReportUndefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nBoxes;
    // clean 
    nBoxes = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        pNtk->fHiePath = 0;
        if ( !Ver_NtkIsDefined(pNtk) )
            nBoxes++;
    }
    // count
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
            if ( pBox->pData && !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
                ((Abc_Ntk_t *)pBox->pData)->fHiePath++;
    // print the stats
    printf( "Warning: The design contains %d undefined object types interpreted as blackboxes:\n", nBoxes );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        if ( !Ver_NtkIsDefined(pNtk) )
            printf( "%s (%d)  ", Abc_NtkName(pNtk), pNtk->fHiePath );
    printf( "\n" );
    // clean 
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHiePath = 0;
}